

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yymatchChar(GREG *G,int c)

{
  int iVar1;
  int c_local;
  GREG *G_local;
  
  if ((G->pos < G->limit) || (iVar1 = yyrefill(G), iVar1 != 0)) {
    if ((uint)(byte)G->buf[G->pos] == c) {
      G->pos = G->pos + 1;
      G_local._4_4_ = 1;
    }
    else {
      G_local._4_4_ = 0;
    }
  }
  else {
    G_local._4_4_ = 0;
  }
  return G_local._4_4_;
}

Assistant:

YY_LOCAL(int) yymatchChar(GREG *G, int c)
{
  if (G->pos >= G->limit && !yyrefill(G)) return 0;
  if ((unsigned char)G->buf[G->pos] == c)
    {
      ++G->pos;
      if (c<32) { yyprintf((stderr, "  ok   yymatchChar '0x%x'", c));}
      else      { yyprintf((stderr, "  ok   yymatchChar '%c'", c));}
      yyprintfGcontext;
      yyprintf((stderr, "\n"));
      return 1;
    }
  if (c<32) { yyprintfv((stderr, "  fail yymatchChar '0x%x'", c));}
  else      { yyprintfv((stderr, "  fail yymatchChar '%c'", c));}
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));
  return 0;
}